

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<FPortalID,_TArray<FPortalSector,_FPortalSector>,_THashTraits<FPortalID>,_TValueTraits<TArray<FPortalSector,_FPortalSector>_>_>
::GetNode(TMap<FPortalID,_TArray<FPortalSector,_FPortalSector>,_THashTraits<FPortalID>,_TValueTraits<TArray<FPortalSector,_FPortalSector>_>_>
          *this,FPortalID *key)

{
  Node *pNVar1;
  FPortalID local_38;
  FPortalID local_28;
  
  local_28.mDisplacement.X = (key->mDisplacement).X;
  local_28.mDisplacement.Y = (key->mDisplacement).Y;
  pNVar1 = FindKey(this,&local_28);
  if (pNVar1 == (Node *)0x0) {
    local_38.mDisplacement.X = (key->mDisplacement).X;
    local_38.mDisplacement.Y = (key->mDisplacement).Y;
    pNVar1 = NewKey(this,&local_38);
    (pNVar1->Pair).Value.Array = (FPortalSector *)0x0;
    (pNVar1->Pair).Value.Most = 0;
    (pNVar1->Pair).Value.Count = 0;
  }
  return pNVar1;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}